

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

int bcf_sr_add_reader(bcf_srs_t *files,char *fname)

{
  int iVar1;
  void *pvVar2;
  tbx_t *ptVar3;
  bcf_hdr_t *pbVar4;
  hts_idx_t *phVar5;
  int *piVar6;
  bcf_sr_regions_t *pbVar7;
  char **local_48;
  char **names;
  int i;
  int n;
  bcf_sr_t *reader;
  htsFile *file_ptr;
  char *fname_local;
  bcf_srs_t *files_local;
  
  file_ptr = (htsFile *)fname;
  fname_local = (char *)files;
  reader = (bcf_sr_t *)hts_open(fname,"r");
  if (reader == (bcf_sr_t *)0x0) {
    fname_local[0x20] = '\0';
    fname_local[0x21] = '\0';
    fname_local[0x22] = '\0';
    fname_local[0x23] = '\0';
    return 0;
  }
  pvVar2 = realloc(*(void **)(fname_local + 0x18),(long)(*(int *)(fname_local + 0x30) + 1) << 2);
  *(void **)(fname_local + 0x18) = pvVar2;
  *(undefined4 *)(*(long *)(fname_local + 0x18) + (long)*(int *)(fname_local + 0x30) * 4) = 0;
  pvVar2 = realloc(*(void **)(fname_local + 0x28),(long)(*(int *)(fname_local + 0x30) + 1) * 0x60);
  *(void **)(fname_local + 0x28) = pvVar2;
  iVar1 = *(int *)(fname_local + 0x30);
  *(int *)(fname_local + 0x30) = iVar1 + 1;
  _i = (long *)(*(long *)(fname_local + 0x28) + (long)iVar1 * 0x60);
  memset(_i,0,0x60);
  *_i = (long)reader;
  fname_local[0x20] = '\0';
  fname_local[0x21] = '\0';
  fname_local[0x22] = '\0';
  fname_local[0x23] = '\0';
  if (*(int *)(fname_local + 0x10) == 0) {
    if ((*(int *)(*_i + 0x44) != 9) && (*(int *)(*_i + 0x44) != 8)) {
      fname_local[0x20] = '\x03';
      fname_local[0x21] = '\0';
      fname_local[0x22] = '\0';
      fname_local[0x23] = '\0';
      return 0;
    }
    pbVar4 = bcf_hdr_read((htsFile *)*_i);
    _i[3] = (long)pbVar4;
    fname_local[0x34] = '\x01';
    fname_local[0x35] = '\0';
    fname_local[0x36] = '\0';
    fname_local[0x37] = '\0';
  }
  else if (*(int *)(*_i + 0x44) == 8) {
    if (*(int *)(*_i + 0x4c) != 2) {
      fname_local[0x20] = '\x01';
      fname_local[0x21] = '\0';
      fname_local[0x22] = '\0';
      fname_local[0x23] = '\0';
      return 0;
    }
    ptVar3 = tbx_index_load((char *)file_ptr);
    _i[1] = (long)ptVar3;
    if (_i[1] == 0) {
      fname_local[0x20] = '\x02';
      fname_local[0x21] = '\0';
      fname_local[0x22] = '\0';
      fname_local[0x23] = '\0';
      return 0;
    }
    pbVar4 = bcf_hdr_read((htsFile *)*_i);
    _i[3] = (long)pbVar4;
  }
  else {
    if (*(int *)(*_i + 0x44) != 9) {
      fname_local[0x20] = '\x03';
      fname_local[0x21] = '\0';
      fname_local[0x22] = '\0';
      fname_local[0x23] = '\0';
      return 0;
    }
    if (*(int *)(*_i + 0x4c) != 2) {
      fname_local[0x20] = '\x01';
      fname_local[0x21] = '\0';
      fname_local[0x22] = '\0';
      fname_local[0x23] = '\0';
      return 0;
    }
    pbVar4 = bcf_hdr_read((htsFile *)*_i);
    _i[3] = (long)pbVar4;
    phVar5 = hts_idx_load((char *)file_ptr,0);
    _i[2] = (long)phVar5;
    if (_i[2] == 0) {
      fname_local[0x20] = '\x02';
      fname_local[0x21] = '\0';
      fname_local[0x22] = '\0';
      fname_local[0x23] = '\0';
      return 0;
    }
  }
  if ((*(int *)(fname_local + 0x34) == 0) || (*(int *)(fname_local + 0x30) < 2)) {
    if ((*(int *)(fname_local + 0x34) == 0) || (*(long *)(fname_local + 0x48) == 0)) {
      if (_i[3] == 0) {
        fname_local[0x20] = '\x05';
        fname_local[0x21] = '\0';
        fname_local[0x22] = '\0';
        fname_local[0x23] = '\0';
        files_local._4_4_ = 0;
      }
      else {
        _i[5] = (long)file_ptr;
        if (*(long *)(fname_local + 8) != 0) {
          piVar6 = init_filters((bcf_hdr_t *)_i[3],*(char **)(fname_local + 8),(int *)(_i + 8));
          _i[9] = (long)piVar6;
        }
        if ((*(int *)(fname_local + 0x38) == 0) && (*(int *)(fname_local + 0x34) == 0)) {
          if (_i[1] == 0) {
            local_48 = bcf_hdr_seqnames((bcf_hdr_t *)_i[3],(int *)((long)&names + 4));
          }
          else {
            local_48 = tbx_seqnames((tbx_t *)_i[1],(int *)((long)&names + 4));
          }
          for (names._0_4_ = 0; (int)names < names._4_4_; names._0_4_ = (int)names + 1) {
            if (*(long *)(fname_local + 0x48) == 0) {
              pbVar7 = _regions_init_string(local_48[(int)names]);
              *(bcf_sr_regions_t **)(fname_local + 0x48) = pbVar7;
            }
            else {
              _regions_add(*(bcf_sr_regions_t **)(fname_local + 0x48),local_48[(int)names],-1,-1);
            }
          }
          free(local_48);
        }
        files_local._4_4_ = 1;
      }
    }
    else {
      fname_local[0x20] = '\x04';
      fname_local[0x21] = '\0';
      fname_local[0x22] = '\0';
      fname_local[0x23] = '\0';
      fprintf(_stderr,"[%s:%d %s] Error: cannot tabix-jump in streaming mode\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
              ,0xd6,"bcf_sr_add_reader");
      files_local._4_4_ = 0;
    }
  }
  else {
    fname_local[0x20] = '\x04';
    fname_local[0x21] = '\0';
    fname_local[0x22] = '\0';
    fname_local[0x23] = '\0';
    fprintf(_stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
            ,0xd0,"bcf_sr_add_reader",(ulong)*(uint *)(fname_local + 0x30));
    files_local._4_4_ = 0;
  }
  return files_local._4_4_;
}

Assistant:

int bcf_sr_add_reader(bcf_srs_t *files, const char *fname)
{
    htsFile* file_ptr = hts_open(fname, "r");
    if ( ! file_ptr ) {
        files->errnum = open_failed;
        return 0;
    }

    files->has_line = (int*) realloc(files->has_line, sizeof(int)*(files->nreaders+1));
    files->has_line[files->nreaders] = 0;
    files->readers  = (bcf_sr_t*) realloc(files->readers, sizeof(bcf_sr_t)*(files->nreaders+1));
    bcf_sr_t *reader = &files->readers[files->nreaders++];
    memset(reader,0,sizeof(bcf_sr_t));

    reader->file = file_ptr;

    files->errnum = 0;

    if ( files->require_index )
    {
        if ( reader->file->format.format==vcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->tbx_idx = tbx_index_load(fname);
            if ( !reader->tbx_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);
        }
        else if ( reader->file->format.format==bcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);

            reader->bcf_idx = bcf_index_load(fname);
            if ( !reader->bcf_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
    }
    else
    {
        if ( reader->file->format.format==bcf || reader->file->format.format==vcf )
        {
            reader->header = bcf_hdr_read(reader->file);
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
        files->streaming = 1;
    }
    if ( files->streaming && files->nreaders>1 )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n", __FILE__,__LINE__,__FUNCTION__,files->nreaders);
        return 0;
    }
    if ( files->streaming && files->regions )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: cannot tabix-jump in streaming mode\n", __FILE__,__LINE__,__FUNCTION__);
        return 0;
    }
    if ( !reader->header )
    {
        files->errnum = header_error;
        return 0;
    }

    reader->fname = fname;
    if ( files->apply_filters )
        reader->filter_ids = init_filters(reader->header, files->apply_filters, &reader->nfilter_ids);

    // Update list of chromosomes
    if ( !files->explicit_regs && !files->streaming )
    {
        int n,i;
        const char **names = reader->tbx_idx ? tbx_seqnames(reader->tbx_idx, &n) : bcf_hdr_seqnames(reader->header, &n);
        for (i=0; i<n; i++)
        {
            if ( !files->regions )
                files->regions = _regions_init_string(names[i]);
            else
                _regions_add(files->regions, names[i], -1, -1);
        }
        free(names);
    }

    return 1;
}